

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

void __thiscall spvtools::opt::IRContext::InitializeCombinators(IRContext *this)

{
  FeatureManager *pFVar1;
  pointer pBVar2;
  long lVar3;
  Module *pMVar4;
  Capability capability;
  Instruction *extension;
  Instruction *extension_00;
  iterator __begin2;
  iterator local_40;
  
  if ((this->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    AnalyzeFeatures(this);
  }
  pFVar1 = (this->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  EnumSet<spv::Capability>::cbegin(&local_40,&pFVar1->capabilities_);
  pBVar2 = *(pointer *)((long)&(pFVar1->capabilities_).buckets_ + 8);
  lVar3 = *(long *)&(pFVar1->capabilities_).buckets_.
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ;
  while (((local_40.set_ != &pFVar1->capabilities_ || (local_40.bucketOffset_ != 0)) ||
         (local_40.bucketIndex_ != (long)pBVar2 - lVar3 >> 4))) {
    capability = EnumSet<spv::Capability>::Iterator::operator*(&local_40);
    AddCombinatorsForCapability(this,capability);
    EnumSet<spv::Capability>::Iterator::operator++(&local_40);
  }
  pMVar4 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (extension_00 = *(Instruction **)
                       ((long)&(pMVar4->ext_inst_imports_).
                               super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      extension_00 !=
      (Instruction *)
      ((long)&(pMVar4->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
      extension_00 = (extension_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)
  {
    AddCombinatorsForExtension(this,extension_00);
  }
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisCombinators;
  return;
}

Assistant:

void IRContext::InitializeCombinators() {
  for (auto capability : get_feature_mgr()->GetCapabilities()) {
    AddCombinatorsForCapability(uint32_t(capability));
  }

  for (auto& extension : module()->ext_inst_imports()) {
    AddCombinatorsForExtension(&extension);
  }

  valid_analyses_ |= kAnalysisCombinators;
}